

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsPathToFramework(string *path)

{
  bool bVar1;
  bool local_11;
  string *path_local;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  local_11 = false;
  if (bVar1) {
    local_11 = cmHasLiteralSuffix<std::__cxx11::string,11ul>(path,(char (*) [11])".framework");
  }
  return local_11;
}

Assistant:

bool cmSystemTools::IsPathToFramework(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".framework"));
}